

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alignment_panel.cxx
# Opt level: O3

void cb_tooltips_button(Fl_Check_Button *param_1,void *param_2)

{
  Fl::option(OPTION_SHOW_TOOLTIPS,
             (tooltips_button->super_Fl_Light_Button).super_Fl_Button.value_ != '\0');
  Fl_Preferences::set(&fluid_prefs,"show_tooltips",
                      (int)(tooltips_button->super_Fl_Light_Button).super_Fl_Button.value_);
  return;
}

Assistant:

static void cb_tooltips_button(Fl_Check_Button*, void*) {
  Fl_Tooltip::enable(tooltips_button->value());
fluid_prefs.set("show_tooltips", tooltips_button->value());
}